

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libretro_main.c
# Opt level: O1

void retro_get_system_av_info(retro_system_av_info *info)

{
  (info->geometry).base_width = 0xa0;
  (info->geometry).base_height = 0x90;
  (info->geometry).max_width = 0xa0;
  (info->geometry).max_height = 0x90;
  (info->geometry).aspect_ratio = 1.1111112;
  (info->timing).fps = 60.0;
  return;
}

Assistant:

void retro_get_system_av_info(struct retro_system_av_info *info)
{
   info->geometry.base_width   = GB_SCREEN_WIDTH;
   info->geometry.base_height  = GB_SCREEN_HEIGHT;
   info->geometry.max_width    = GB_SCREEN_WIDTH;
   info->geometry.max_height   = GB_SCREEN_HEIGHT;
   info->geometry.aspect_ratio = (float)GB_SCREEN_WIDTH / (float)GB_SCREEN_HEIGHT;

   info->timing.fps = 60.0f;
}